

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

ly_bool trop_leaf_is_key(lysp_node *pn,lysp_node_list *ca_last_list)

{
  ly_bool lVar1;
  lysp_node_list *list;
  lysp_node_leaf *leaf;
  lysp_node_list *ca_last_list_local;
  lysp_node *pn_local;
  
  if (ca_last_list == (lysp_node_list *)0x0) {
    pn_local._7_1_ = '\0';
  }
  else {
    lVar1 = trg_charptr_has_data(ca_last_list->key);
    if (lVar1 == '\0') {
      pn_local._7_1_ = '\0';
    }
    else {
      pn_local._7_1_ = trg_word_is_present(ca_last_list->key,pn->name,' ');
    }
  }
  return pn_local._7_1_;
}

Assistant:

static ly_bool
trop_leaf_is_key(const struct lysp_node *pn, const struct lysp_node_list *ca_last_list)
{
    const struct lysp_node_leaf *leaf = (const struct lysp_node_leaf *)pn;
    const struct lysp_node_list *list = ca_last_list;

    if (!list) {
        return 0;
    }
    return trg_charptr_has_data(list->key) ?
           trg_word_is_present(list->key, leaf->name, ' ') : 0;
}